

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O0

int getSubsamp(j_decompress_ptr dinfo)

{
  int match_2;
  int vref_1;
  int href_1;
  int match_1;
  int vref;
  int href;
  int match;
  int k;
  int i;
  int retval;
  j_decompress_ptr dinfo_local;
  int local_4;
  
  retval = -1;
  if ((dinfo->num_components == 1) && (dinfo->jpeg_color_space == JCS_GRAYSCALE)) {
    local_4 = 3;
  }
  else {
    for (i = 0; i < 6; i = i + 1) {
      if ((dinfo->num_components == pixelsize[i]) ||
         ((((dinfo->jpeg_color_space == JCS_YCCK || (dinfo->jpeg_color_space == JCS_CMYK)) &&
           (pixelsize[i] == 3)) && (dinfo->num_components == 4)))) {
        if ((dinfo->comp_info->h_samp_factor == tjMCUWidth[i] / 8) &&
           (dinfo->comp_info->v_samp_factor == tjMCUHeight[i] / 8)) {
          match = 0;
          for (k = 1; k < dinfo->num_components; k = k + 1) {
            href = 1;
            vref = 1;
            if (((dinfo->jpeg_color_space == JCS_YCCK) || (dinfo->jpeg_color_space == JCS_CMYK)) &&
               (k == 3)) {
              href = tjMCUWidth[i] / 8;
              vref = tjMCUHeight[i] / 8;
            }
            if ((dinfo->comp_info[k].h_samp_factor == href) &&
               (dinfo->comp_info[k].v_samp_factor == vref)) {
              match = match + 1;
            }
          }
          if (match == dinfo->num_components + -1) {
            retval = i;
            break;
          }
        }
        if (((dinfo->comp_info->h_samp_factor == 2) && (dinfo->comp_info->v_samp_factor == 2)) &&
           ((i == 1 || (i == 4)))) {
          match_1 = 0;
          for (k = 1; k < dinfo->num_components; k = k + 1) {
            href_1 = tjMCUHeight[i] / 8;
            vref_1 = tjMCUWidth[i] / 8;
            if (((dinfo->jpeg_color_space == JCS_YCCK) || (dinfo->jpeg_color_space == JCS_CMYK)) &&
               (k == 3)) {
              vref_1 = 2;
              href_1 = 2;
            }
            if ((dinfo->comp_info[k].h_samp_factor == href_1) &&
               (dinfo->comp_info[k].v_samp_factor == vref_1)) {
              match_1 = match_1 + 1;
            }
          }
          if (match_1 == dinfo->num_components + -1) {
            retval = i;
            break;
          }
        }
        if ((dinfo->comp_info->h_samp_factor * dinfo->comp_info->v_samp_factor <=
             (int)(10 / (long)pixelsize[i])) && (i == 0)) {
          match_2 = 0;
          for (k = 1; k < dinfo->num_components; k = k + 1) {
            if ((dinfo->comp_info[k].h_samp_factor == dinfo->comp_info->h_samp_factor) &&
               (dinfo->comp_info[k].v_samp_factor == dinfo->comp_info->v_samp_factor)) {
              match_2 = match_2 + 1;
            }
            if (match_2 == dinfo->num_components + -1) {
              retval = i;
              break;
            }
          }
        }
      }
    }
    local_4 = retval;
  }
  return local_4;
}

Assistant:

static int getSubsamp(j_decompress_ptr dinfo)
{
  int retval = -1, i, k;

  /* The sampling factors actually have no meaning with grayscale JPEG files,
     and in fact it's possible to generate grayscale JPEGs with sampling
     factors > 1 (even though those sampling factors are ignored by the
     decompressor.)  Thus, we need to treat grayscale as a special case. */
  if (dinfo->num_components == 1 && dinfo->jpeg_color_space == JCS_GRAYSCALE)
    return TJSAMP_GRAY;

  for (i = 0; i < NUMSUBOPT; i++) {
    if (dinfo->num_components == pixelsize[i] ||
        ((dinfo->jpeg_color_space == JCS_YCCK ||
          dinfo->jpeg_color_space == JCS_CMYK) &&
         pixelsize[i] == 3 && dinfo->num_components == 4)) {
      if (dinfo->comp_info[0].h_samp_factor == tjMCUWidth[i] / 8 &&
          dinfo->comp_info[0].v_samp_factor == tjMCUHeight[i] / 8) {
        int match = 0;

        for (k = 1; k < dinfo->num_components; k++) {
          int href = 1, vref = 1;

          if ((dinfo->jpeg_color_space == JCS_YCCK ||
               dinfo->jpeg_color_space == JCS_CMYK) && k == 3) {
            href = tjMCUWidth[i] / 8;  vref = tjMCUHeight[i] / 8;
          }
          if (dinfo->comp_info[k].h_samp_factor == href &&
              dinfo->comp_info[k].v_samp_factor == vref)
            match++;
        }
        if (match == dinfo->num_components - 1) {
          retval = i;  break;
        }
      }
      /* Handle 4:2:2 and 4:4:0 images whose sampling factors are specified
         in non-standard ways. */
      if (dinfo->comp_info[0].h_samp_factor == 2 &&
          dinfo->comp_info[0].v_samp_factor == 2 &&
          (i == TJSAMP_422 || i == TJSAMP_440)) {
        int match = 0;

        for (k = 1; k < dinfo->num_components; k++) {
          int href = tjMCUHeight[i] / 8, vref = tjMCUWidth[i] / 8;

          if ((dinfo->jpeg_color_space == JCS_YCCK ||
               dinfo->jpeg_color_space == JCS_CMYK) && k == 3) {
            href = vref = 2;
          }
          if (dinfo->comp_info[k].h_samp_factor == href &&
              dinfo->comp_info[k].v_samp_factor == vref)
            match++;
        }
        if (match == dinfo->num_components - 1) {
          retval = i;  break;
        }
      }
      /* Handle 4:4:4 images whose sampling factors are specified in
         non-standard ways. */
      if (dinfo->comp_info[0].h_samp_factor *
          dinfo->comp_info[0].v_samp_factor <=
          D_MAX_BLOCKS_IN_MCU / pixelsize[i] && i == TJSAMP_444) {
        int match = 0;
        for (k = 1; k < dinfo->num_components; k++) {
          if (dinfo->comp_info[k].h_samp_factor ==
              dinfo->comp_info[0].h_samp_factor &&
              dinfo->comp_info[k].v_samp_factor ==
              dinfo->comp_info[0].v_samp_factor)
            match++;
          if (match == dinfo->num_components - 1) {
            retval = i;  break;
          }
        }
      }
    }
  }
  return retval;
}